

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::EpsCopyOutputStream::GetDirectBufferPointer
          (EpsCopyOutputStream *this,void **data,int *size,uint8 **pp)

{
  EpsCopyOutputStream *pEVar1;
  uint8 *puVar2;
  bool bVar3;
  int iVar4;
  uint8 *puVar5;
  
  if (this->had_error_ != true) {
    iVar4 = Flush(this,*pp);
    *size = iVar4;
    if (this->had_error_ != true) {
      *data = this->buffer_end_;
      do {
        iVar4 = *size;
        if ((long)iVar4 != 0) {
          puVar2 = (uint8 *)*data;
          pEVar1 = (EpsCopyOutputStream *)(puVar2 + -0x10);
          if (iVar4 < 0x11) {
            pEVar1 = (EpsCopyOutputStream *)this->buffer_;
          }
          puVar5 = (uint8 *)0x0;
          if (iVar4 < 0x11) {
            puVar5 = puVar2;
          }
          this->end_ = pEVar1->buffer_ + (long)iVar4 + -0x10;
          this->buffer_end_ = puVar5;
          puVar5 = this->buffer_;
          if (0x10 < iVar4) {
            puVar5 = puVar2;
          }
          bVar3 = true;
          goto LAB_0016a0c6;
        }
        iVar4 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])(this->stream_,data,size);
      } while ((char)iVar4 != '\0');
      this->had_error_ = true;
      this->end_ = this->buffer_ + 0x10;
    }
  }
  puVar5 = this->buffer_;
  bVar3 = false;
LAB_0016a0c6:
  *pp = puVar5;
  return bVar3;
}

Assistant:

bool EpsCopyOutputStream::GetDirectBufferPointer(void** data, int* size,
                                                 uint8** pp) {
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  *size = Flush(*pp);
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  *data = buffer_end_;
  while (*size == 0) {
    if (!stream_->Next(data, size)) {
      *pp = Error();
      return false;
    }
  }
  *pp = SetInitialBuffer(*data, *size);
  return true;
}